

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O3

void __thiscall Assimp::ObjFileParser::getMaterialLib(ObjFileParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte *pbVar3;
  long lVar4;
  IOSystem *pIVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  IOStream *stream;
  Logger *pLVar7;
  long *plVar8;
  undefined4 extraout_var_02;
  byte *pbVar9;
  size_type *psVar10;
  byte *pbVar11;
  ulong uVar12;
  _Alloc_hider _Var13;
  vector<char,_std::allocator<char>_> buffer;
  string strMatName;
  string absName;
  ObjFileMtlImporter mtlImporter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d8;
  string local_8b0;
  undefined1 *local_890;
  undefined8 local_888;
  undefined1 local_880;
  undefined7 uStack_87f;
  ObjFileMtlImporter local_870;
  undefined4 extraout_var_01;
  
  pbVar11 = (byte *)(this->m_DataIt)._M_current;
  pbVar3 = (byte *)(this->m_DataItEnd)._M_current;
  pbVar9 = pbVar3 + -1;
  if (pbVar9 != pbVar11 && pbVar11 != pbVar3) {
    do {
      if (((ulong)*pbVar11 < 0x21) && ((0x100003601U >> ((ulong)*pbVar11 & 0x3f) & 1) != 0))
      goto LAB_0045cf38;
      pbVar11 = pbVar11 + 1;
    } while ((pbVar11 != pbVar3) && (pbVar11 != pbVar9));
  }
LAB_0045cf45:
  (this->m_DataIt)._M_current = (char *)pbVar11;
  if (pbVar11 == pbVar3) {
    return;
  }
  do {
    if ((*pbVar11 < 0xe) && ((0x3401U >> (*pbVar11 & 0x1f) & 1) != 0)) break;
    pbVar11 = pbVar11 + 1;
    (this->m_DataIt)._M_current = (char *)pbVar11;
  } while (pbVar11 != pbVar3);
  local_8b0._M_dataplus._M_p = (pointer)&local_8b0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_8b0);
  local_888 = 0;
  local_880 = 0;
  local_890 = &local_880;
  if (local_8b0._M_string_length == 0) {
    pLVar7 = DefaultLogger::get();
    Logger::warn(pLVar7,"OBJ: no name for material library specified.");
    goto LAB_0045d132;
  }
  iVar6 = (*this->m_pIO->_vptr_IOSystem[9])();
  if (CONCAT44(extraout_var,iVar6) == 0) {
    std::__cxx11::string::_M_assign((string *)&local_890);
  }
  else {
    iVar6 = (*this->m_pIO->_vptr_IOSystem[8])();
    paVar1 = &local_870.m_strAbsPath.field_2;
    lVar4 = *(long *)CONCAT44(extraout_var_00,iVar6);
    local_870.m_strAbsPath._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_870,lVar4,((long *)CONCAT44(extraout_var_00,iVar6))[1] + lVar4);
    if (local_870.m_strAbsPath._M_dataplus._M_p[local_870.m_strAbsPath._M_string_length - 1] != '/')
    {
      std::__cxx11::string::push_back((char)&local_870);
    }
    std::__cxx11::string::_M_append
              ((char *)&local_890,(ulong)local_870.m_strAbsPath._M_dataplus._M_p);
    std::__cxx11::string::_M_append((char *)&local_890,(ulong)local_8b0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_870.m_strAbsPath._M_dataplus._M_p != paVar1) {
      operator_delete(local_870.m_strAbsPath._M_dataplus._M_p,
                      local_870.m_strAbsPath.field_2._M_allocated_capacity + 1);
    }
  }
  pIVar5 = this->m_pIO;
  paVar1 = &local_870.m_strAbsPath.field_2;
  local_870.m_strAbsPath._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_870,"rb","");
  iVar6 = (*pIVar5->_vptr_IOSystem[4])(pIVar5,local_890,local_870.m_strAbsPath._M_dataplus._M_p);
  stream = (IOStream *)CONCAT44(extraout_var_01,iVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_870.m_strAbsPath._M_dataplus._M_p != paVar1) {
    operator_delete(local_870.m_strAbsPath._M_dataplus._M_p,
                    local_870.m_strAbsPath.field_2._M_allocated_capacity + 1);
  }
  if (stream == (IOStream *)0x0) {
    pLVar7 = DefaultLogger::get();
    std::operator+(&local_870.m_strAbsPath,"OBJ: Unable to locate material file ",&local_8b0);
    Logger::error(pLVar7,local_870.m_strAbsPath._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_870.m_strAbsPath._M_dataplus._M_p != paVar1) {
      operator_delete(local_870.m_strAbsPath._M_dataplus._M_p,
                      local_870.m_strAbsPath.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::substr((ulong)&local_8d8,(ulong)&this->m_originalObjFileName);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_8d8);
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_870.m_strAbsPath.field_2._M_allocated_capacity = *psVar10;
      local_870.m_strAbsPath.field_2._8_8_ = plVar8[3];
      local_870.m_strAbsPath._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_870.m_strAbsPath.field_2._M_allocated_capacity = *psVar10;
      local_870.m_strAbsPath._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_870.m_strAbsPath._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    paVar2 = &local_8d8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_8d8._M_dataplus._M_p,local_8d8.field_2._M_allocated_capacity + 1);
    }
    pLVar7 = DefaultLogger::get();
    std::operator+(&local_8d8,"OBJ: Opening fallback material file ",&local_870.m_strAbsPath);
    Logger::info(pLVar7,local_8d8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_8d8._M_dataplus._M_p,local_8d8.field_2._M_allocated_capacity + 1);
    }
    pIVar5 = this->m_pIO;
    local_8d8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d8,"rb","");
    iVar6 = (*pIVar5->_vptr_IOSystem[4])
                      (pIVar5,local_870.m_strAbsPath._M_dataplus._M_p,local_8d8._M_dataplus._M_p);
    stream = (IOStream *)CONCAT44(extraout_var_02,iVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_8d8._M_dataplus._M_p,local_8d8.field_2._M_allocated_capacity + 1);
    }
    if (stream != (IOStream *)0x0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_870.m_strAbsPath._M_dataplus._M_p != paVar1) {
        operator_delete(local_870.m_strAbsPath._M_dataplus._M_p,
                        local_870.m_strAbsPath.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0045d0d1;
    }
    pLVar7 = DefaultLogger::get();
    std::operator+(&local_8d8,"OBJ: Unable to locate fallback material file ",
                   &local_870.m_strAbsPath);
    Logger::error(pLVar7,local_8d8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_8d8._M_dataplus._M_p,local_8d8.field_2._M_allocated_capacity + 1);
    }
    pbVar9 = (byte *)(this->m_DataIt)._M_current;
    pbVar11 = (byte *)(this->m_DataItEnd)._M_current;
    if (pbVar11 + -1 != pbVar9 && pbVar9 != pbVar11) {
      do {
        if (((*pbVar9 < 0xe) && ((0x3401U >> (*pbVar9 & 0x1f) & 1) != 0)) ||
           (pbVar9 = pbVar9 + 1, pbVar9 == pbVar11)) break;
      } while (pbVar9 != pbVar11 + -1);
    }
    pbVar3 = pbVar9;
    if (pbVar9 != pbVar11) {
      pbVar9 = pbVar9 + 1;
      this->m_uiLine = this->m_uiLine + 1;
      pbVar3 = pbVar9;
    }
    for (; (pbVar3 != pbVar11 && ((*pbVar3 == 0x20 || (pbVar9 = pbVar3, *pbVar3 == 9))));
        pbVar3 = pbVar3 + 1) {
      pbVar9 = pbVar11;
    }
    (this->m_DataIt)._M_current = (char *)pbVar9;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_870.m_strAbsPath._M_dataplus._M_p == paVar1) goto LAB_0045d132;
    uVar12 = local_870.m_strAbsPath.field_2._M_allocated_capacity + 1;
    _Var13._M_p = local_870.m_strAbsPath._M_dataplus._M_p;
  }
  else {
LAB_0045d0d1:
    local_8d8._M_dataplus._M_p = (pointer)0x0;
    local_8d8._M_string_length = 0;
    local_8d8.field_2._M_allocated_capacity = 0;
    BaseImporter::TextFileToBuffer
              (stream,(vector<char,_std::allocator<char>_> *)&local_8d8,ALLOW_EMPTY);
    (*this->m_pIO->_vptr_IOSystem[5])(this->m_pIO,stream);
    ObjFileMtlImporter::ObjFileMtlImporter
              (&local_870,(vector<char,_std::allocator<char>_> *)&local_8d8,&local_8b0,
               (this->m_pModel)._M_t.
               super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
               .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl);
    ObjFileMtlImporter::~ObjFileMtlImporter(&local_870);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d8._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_0045d132;
    uVar12 = local_8d8.field_2._M_allocated_capacity - (long)local_8d8._M_dataplus._M_p;
    _Var13._M_p = local_8d8._M_dataplus._M_p;
  }
  operator_delete(_Var13._M_p,uVar12);
LAB_0045d132:
  if (local_890 != &local_880) {
    operator_delete(local_890,CONCAT71(uStack_87f,local_880) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b0._M_dataplus._M_p != &local_8b0.field_2) {
    operator_delete(local_8b0._M_dataplus._M_p,local_8b0.field_2._M_allocated_capacity + 1);
  }
  return;
LAB_0045cf38:
  if ((*pbVar11 != 0x20) && (*pbVar11 != 9)) goto LAB_0045cf45;
  pbVar11 = pbVar11 + 1;
  if ((pbVar11 == pbVar3) || (pbVar11 == pbVar9)) goto LAB_0045cf45;
  goto LAB_0045cf38;
}

Assistant:

void ObjFileParser::getMaterialLib() {
    // Translate tuple
    m_DataIt = getNextToken<DataArrayIt>(m_DataIt, m_DataItEnd);
    if( m_DataIt == m_DataItEnd ) {
        return;
    }

    char *pStart = &(*m_DataIt);
    while( m_DataIt != m_DataItEnd && !IsLineEnd( *m_DataIt ) ) {
        ++m_DataIt;
    }

    // Check for existence
    const std::string strMatName(pStart, &(*m_DataIt));
    std::string absName;

	// Check if directive is valid.
    if ( 0 == strMatName.length() ) {
        ASSIMP_LOG_WARN( "OBJ: no name for material library specified." );
        return;
    }

    if ( m_pIO->StackSize() > 0 ) {
        std::string path = m_pIO->CurrentDirectory();
        if ( '/' != *path.rbegin() ) {
          path += '/';
        }
        absName += path;
        absName += strMatName;
    } else {
        absName = strMatName;
    }

    IOStream *pFile = m_pIO->Open( absName );
    if ( nullptr == pFile ) {
        ASSIMP_LOG_ERROR("OBJ: Unable to locate material file " + strMatName);
        std::string strMatFallbackName = m_originalObjFileName.substr(0, m_originalObjFileName.length() - 3) + "mtl";
        ASSIMP_LOG_INFO("OBJ: Opening fallback material file " + strMatFallbackName);
        pFile = m_pIO->Open(strMatFallbackName);
        if (!pFile) {
            ASSIMP_LOG_ERROR("OBJ: Unable to locate fallback material file " + strMatFallbackName);
            m_DataIt = skipLine<DataArrayIt>(m_DataIt, m_DataItEnd, m_uiLine);
            return;
        }
    }

    // Import material library data from file.
    // Some exporters (e.g. Silo) will happily write out empty
    // material files if the model doesn't use any materials, so we
    // allow that.
    std::vector<char> buffer;
    BaseImporter::TextFileToBuffer( pFile, buffer, BaseImporter::ALLOW_EMPTY );
    m_pIO->Close( pFile );

    // Importing the material library
    ObjFileMtlImporter mtlImporter( buffer, strMatName, m_pModel.get() );
}